

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

bool __thiscall cmake::GetDevWarningsAsErrors(cmake *this,cmMakefile *mf)

{
  cmState *this_00;
  bool bVar1;
  char *val;
  string local_60;
  string local_40;
  
  if (mf == (cmMakefile *)0x0) {
    this_00 = this->State;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"CMAKE_SUPPRESS_DEVELOPER_ERRORS","");
    val = cmState::GetCacheEntryValue(this_00,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if (val == (char *)0x0) {
      bVar1 = false;
    }
    else {
      bVar1 = cmSystemTools::IsOff(val);
    }
  }
  else {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"CMAKE_SUPPRESS_DEVELOPER_ERRORS","");
    bVar1 = cmMakefile::IsSet(mf,&local_60);
    if (bVar1) {
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"CMAKE_SUPPRESS_DEVELOPER_ERRORS","");
      bVar1 = cmMakefile::IsOn(mf,&local_40);
      bVar1 = !bVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      bVar1 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar1;
}

Assistant:

bool cmake::GetDevWarningsAsErrors(cmMakefile const* mf)
{
  if (mf)
    {
    return (mf->IsSet("CMAKE_SUPPRESS_DEVELOPER_ERRORS") &&
            !mf->IsOn("CMAKE_SUPPRESS_DEVELOPER_ERRORS"));
    }
  else
    {
    const char* cacheEntryValue = this->State->GetCacheEntryValue(
      "CMAKE_SUPPRESS_DEVELOPER_ERRORS");
    return cacheEntryValue && cmSystemTools::IsOff(cacheEntryValue);
    }
}